

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O1

int xmlNanoFTPSendUser(void *ctx)

{
  size_t sVar1;
  ssize_t sVar2;
  int iVar3;
  char buf [200];
  char local_d8 [199];
  undefined1 local_11;
  
  if (*(long *)((long)ctx + 0x20) == 0) {
    builtin_strncpy(local_d8,"USER anonymous\r\n",0x11);
  }
  else {
    snprintf(local_d8,200,"USER %s\r\n");
  }
  local_11 = 0;
  sVar1 = strlen(local_d8);
  sVar2 = send(*(int *)((long)ctx + 0x44),local_d8,(long)(int)sVar1,0);
  iVar3 = 0;
  if ((int)sVar2 < 0) {
    __xmlIOErr(9,0,"send failed");
    iVar3 = (int)sVar2;
  }
  return iVar3;
}

Assistant:

static int
xmlNanoFTPSendUser(void *ctx) {
    xmlNanoFTPCtxtPtr ctxt = (xmlNanoFTPCtxtPtr) ctx;
    char buf[200];
    int len;
    int res;

    if (ctxt->user == NULL)
	snprintf(buf, sizeof(buf), "USER anonymous\r\n");
    else
	snprintf(buf, sizeof(buf), "USER %s\r\n", ctxt->user);
    buf[sizeof(buf) - 1] = 0;
    len = strlen(buf);
#ifdef DEBUG_FTP
    xmlGenericError(xmlGenericErrorContext, "%s", buf);
#endif
    res = send(ctxt->controlFd, SEND_ARG2_CAST buf, len, 0);
    if (res < 0) {
	__xmlIOErr(XML_FROM_FTP, 0, "send failed");
	return(res);
    }
    return(0);
}